

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verFormula.c
# Opt level: O2

Hop_Obj_t * Ver_FormulaParserTopOper(Hop_Man_t *pMan,Vec_Ptr_t *vStackFn,int Oper)

{
  Hop_Obj_t *pHVar1;
  Hop_Obj_t *p0;
  Hop_Obj_t *pC;
  
  pHVar1 = (Hop_Obj_t *)Vec_PtrPop(vStackFn);
  p0 = (Hop_Obj_t *)Vec_PtrPop(vStackFn);
  switch(Oper) {
  case 2:
    pC = (Hop_Obj_t *)Vec_PtrPop(vStackFn);
    pHVar1 = Hop_Mux(pMan,pC,p0,pHVar1);
    break;
  case 3:
    pHVar1 = Hop_Exor(pMan,p0,pHVar1);
    pHVar1 = (Hop_Obj_t *)((ulong)pHVar1 ^ 1);
    break;
  case 4:
    pHVar1 = Hop_Or(pMan,p0,pHVar1);
    break;
  case 5:
    pHVar1 = Hop_Exor(pMan,p0,pHVar1);
    break;
  case 6:
    pHVar1 = Hop_And(pMan,p0,pHVar1);
    break;
  default:
    return (Hop_Obj_t *)0x0;
  }
  Vec_PtrPush(vStackFn,pHVar1);
  return pHVar1;
}

Assistant:

Hop_Obj_t * Ver_FormulaParserTopOper( Hop_Man_t * pMan, Vec_Ptr_t * vStackFn, int Oper )
{
    Hop_Obj_t * bArg0, * bArg1, * bArg2, * bFunc;
    // perform the given operation
    bArg2 = (Hop_Obj_t *)Vec_PtrPop( vStackFn );
    bArg1 = (Hop_Obj_t *)Vec_PtrPop( vStackFn );
	if ( Oper == VER_PARSE_OPER_AND )
		bFunc = Hop_And( pMan, bArg1, bArg2 );
	else if ( Oper == VER_PARSE_OPER_XOR )
		bFunc = Hop_Exor( pMan, bArg1, bArg2 );
	else if ( Oper == VER_PARSE_OPER_OR )
		bFunc = Hop_Or( pMan, bArg1, bArg2 );
	else if ( Oper == VER_PARSE_OPER_EQU )
		bFunc = Hop_Not( Hop_Exor( pMan, bArg1, bArg2 ) );
	else if ( Oper == VER_PARSE_OPER_MUX )
    {
        bArg0 = (Hop_Obj_t *)Vec_PtrPop( vStackFn );
//		bFunc = Cudd_bddIte( dd, bArg0, bArg1, bArg2 );  Cudd_Ref( bFunc );
		bFunc = Hop_Mux( pMan, bArg0, bArg1, bArg2 ); 
//        Cudd_RecursiveDeref( dd, bArg0 );
//        Cudd_Deref( bFunc );
    }
	else
		return NULL;
//    Cudd_Ref( bFunc );
//    Cudd_RecursiveDeref( dd, bArg1 );
//    Cudd_RecursiveDeref( dd, bArg2 );
	Vec_PtrPush( vStackFn,  bFunc );
    return bFunc;
}